

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::SeekHead::Finalize(SeekHead *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 extraout_var;
  uint64_t uVar6;
  undefined4 extraout_var_00;
  long lVar7;
  SeekHead *this_00;
  uint64 uVar8;
  bool bVar9;
  uint64_t entry_size [5];
  uint64 auStack_70 [8];
  
  auStack_70[2] = 0x14e711;
  iVar2 = (*writer->_vptr_IMkvWriter[3])(writer);
  bVar9 = true;
  if ((char)iVar2 != '\0') {
    if (this->start_pos_ == -1) {
      bVar9 = false;
    }
    else {
      lVar7 = 3;
      uVar8 = 0;
      do {
        if ((ulong)this->seek_entry_id_[lVar7 + -3] != 0) {
          auStack_70[2] = 0x14e743;
          uVar4 = EbmlElementSize(0x53ab,(ulong)this->seek_entry_id_[lVar7 + -3]);
          auStack_70[2] = 0x14e754;
          uVar5 = EbmlElementSize(0x53ac,*(uint64 *)(this->seek_entry_id_ + lVar7 * 2));
          uVar5 = uVar5 + uVar4;
          auStack_70[lVar7] = uVar5;
          auStack_70[2] = 0x14e76c;
          uVar4 = EbmlMasterElementSize(0x4dbb,uVar5);
          uVar8 = uVar5 + uVar8 + uVar4;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      bVar9 = uVar8 == 0;
      if (!bVar9) {
        auStack_70[2] = 0x14e794;
        iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
        auStack_70[2] = 0x14e7a4;
        iVar3 = (*writer->_vptr_IMkvWriter[2])(writer,this->start_pos_);
        if (iVar3 == 0) {
          auStack_70[2] = 0x14e7bc;
          this_00 = (SeekHead *)writer;
          bVar1 = WriteEbmlMasterElement(writer,0x114d9b74,uVar8);
          if (bVar1) {
            lVar7 = 3;
            do {
              if (this->seek_entry_id_[lVar7 + -3] != 0) {
                auStack_70[2] = 0x14e7e4;
                bVar1 = WriteEbmlMasterElement(writer,0x4dbb,auStack_70[lVar7]);
                if (!bVar1) {
                  return bVar9;
                }
                auStack_70[2] = 0x14e7fe;
                bVar1 = WriteEbmlElement(writer,0x53ab,(ulong)this->seek_entry_id_[lVar7 + -3]);
                if (!bVar1) {
                  return bVar9;
                }
                auStack_70[2] = 0x14e813;
                this_00 = (SeekHead *)writer;
                bVar1 = WriteEbmlElement(writer,0x53ac,*(uint64 *)(this->seek_entry_id_ + lVar7 * 2)
                                        );
                if (!bVar1) {
                  return bVar9;
                }
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != 8);
            auStack_70[2] = 0x14e825;
            uVar6 = MaxEntrySize(this_00);
            auStack_70[2] = 0x14e836;
            uVar8 = EbmlMasterElementSize(0x114d9b74,uVar6 * 5);
            auStack_70[2] = 0x14e842;
            iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
            auStack_70[2] = 0x14e857;
            uVar8 = WriteVoidElement(writer,((uVar8 + uVar6 * 5) - CONCAT44(extraout_var_00,iVar3))
                                            + this->start_pos_);
            if (uVar8 != 0) {
              auStack_70[2] = 0x14e868;
              iVar2 = (*writer->_vptr_IMkvWriter[2])(writer,CONCAT44(extraout_var,iVar2));
              if (iVar2 == 0) {
                bVar9 = true;
              }
            }
          }
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool SeekHead::Finalize(IMkvWriter* writer) const {
  if (writer->Seekable()) {
    if (start_pos_ == -1)
      return false;

    uint64_t payload_size = 0;
    uint64_t entry_size[kSeekEntryCount];

    for (int32_t i = 0; i < kSeekEntryCount; ++i) {
      if (seek_entry_id_[i] != 0) {
        entry_size[i] = EbmlElementSize(libwebm::kMkvSeekID,
                                        static_cast<uint64>(seek_entry_id_[i]));
        entry_size[i] += EbmlElementSize(
            libwebm::kMkvSeekPosition, static_cast<uint64>(seek_entry_pos_[i]));

        payload_size +=
            EbmlMasterElementSize(libwebm::kMkvSeek, entry_size[i]) +
            entry_size[i];
      }
    }

    // No SeekHead elements
    if (payload_size == 0)
      return true;

    const int64_t pos = writer->Position();
    if (writer->Position(start_pos_))
      return false;

    if (!WriteEbmlMasterElement(writer, libwebm::kMkvSeekHead, payload_size))
      return false;

    for (int32_t i = 0; i < kSeekEntryCount; ++i) {
      if (seek_entry_id_[i] != 0) {
        if (!WriteEbmlMasterElement(writer, libwebm::kMkvSeek, entry_size[i]))
          return false;

        if (!WriteEbmlElement(writer, libwebm::kMkvSeekID,
                              static_cast<uint64>(seek_entry_id_[i])))
          return false;

        if (!WriteEbmlElement(writer, libwebm::kMkvSeekPosition,
                              static_cast<uint64>(seek_entry_pos_[i])))
          return false;
      }
    }

    const uint64_t total_entry_size = kSeekEntryCount * MaxEntrySize();
    const uint64_t total_size =
        EbmlMasterElementSize(libwebm::kMkvSeekHead, total_entry_size) +
        total_entry_size;
    const int64_t size_left = total_size - (writer->Position() - start_pos_);

    const uint64_t bytes_written = WriteVoidElement(writer, size_left);
    if (!bytes_written)
      return false;

    if (writer->Position(pos))
      return false;
  }

  return true;
}